

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

AV1Decoder * av1_decoder_create(BufferPool *pool)

{
  int iVar1;
  qm_val_t *pqVar2;
  AVxWorkerInterface *pAVar3;
  BufferPool *in_RDI;
  int i;
  AV1_COMMON *cm;
  AV1Decoder *pbi;
  size_t in_stack_ffffffffffffffe0;
  AV1Decoder *pbi_00;
  size_t in_stack_ffffffffffffffe8;
  AV1Decoder *local_8;
  
  local_8 = (AV1Decoder *)aom_memalign(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (local_8 == (AV1Decoder *)0x0) {
    local_8 = (AV1Decoder *)0x0;
  }
  else {
    memset(local_8,0,0x600c0);
    pbi_00 = (AV1Decoder *)&local_8->common;
    (local_8->common).seq_params = &local_8->seq_params;
    (local_8->common).error = &local_8->error;
    iVar1 = _setjmp((__jmp_buf_tag *)(local_8->error).jmp);
    if (iVar1 == 0) {
      (local_8->error).setjmp = 1;
      pqVar2 = (qm_val_t *)aom_memalign((size_t)local_8,(size_t)pbi_00);
      (pbi_00->common).quant_params.gqmatrix[3][0][0xe] = pqVar2;
      if ((pbi_00->common).quant_params.gqmatrix[3][0][0xe] == (qm_val_t *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)&(pbi_00->dcb).xd.plane[0].dst.width,
                           AOM_CODEC_MEM_ERROR,"Failed to allocate cm->fc");
      }
      pqVar2 = (qm_val_t *)aom_memalign((size_t)local_8,(size_t)pbi_00);
      (pbi_00->common).quant_params.gqmatrix[3][0][0xf] = pqVar2;
      if ((pbi_00->common).quant_params.gqmatrix[3][0][0xf] == (qm_val_t *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)&(pbi_00->dcb).xd.plane[0].dst.width,
                           AOM_CODEC_MEM_ERROR,"Failed to allocate cm->default_frame_context");
      }
      memset((pbi_00->common).quant_params.gqmatrix[3][0][0xe],0,0x52fc);
      memset((pbi_00->common).quant_params.gqmatrix[3][0][0xf],0,0x52fc);
      local_8->need_resync = 1;
      initialize_dec();
      for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
        (pbi_00->dcb).xd.plane[0].seg_iqmatrix[1][(long)iVar1 + 9] = (qm_val_t *)0x0;
      }
      *(undefined4 *)(pbi_00->dcb).xd.plane = 0;
      local_8->decoding_first_frame = 1;
      (local_8->common).buffer_pool = in_RDI;
      pqVar2 = (pbi_00->common).quant_params.gqmatrix[3][0][0xd];
      pqVar2[0x48] = '\b';
      pqVar2[0x49] = '\0';
      pqVar2[0x4a] = '\0';
      pqVar2[0x4b] = '\0';
      (pbi_00->dcb).xd.plane[0].seg_iqmatrix[2][0xc] = (qm_val_t *)dec_free_mi;
      (pbi_00->dcb).xd.plane[0].seg_iqmatrix[2][0xd] = (qm_val_t *)dec_setup_mi;
      (pbi_00->dcb).xd.plane[0].seg_iqmatrix[2][0xe] = (qm_val_t *)dec_set_mb_mi;
      av1_loop_filter_init((AV1_COMMON *)pbi_00);
      av1_num_planes((AV1_COMMON *)pbi_00);
      av1_qm_init((CommonQuantParams *)pbi_00,iVar1);
      av1_loop_restoration_precal();
      (local_8->error).setjmp = 0;
      pAVar3 = aom_get_worker_interface();
      (*pAVar3->init)(&local_8->lf_worker);
      (local_8->lf_worker).thread_name = "aom lf worker";
    }
    else {
      (local_8->error).setjmp = 0;
      av1_decoder_remove(pbi_00);
      local_8 = (AV1Decoder *)0x0;
    }
  }
  return local_8;
}

Assistant:

AV1Decoder *av1_decoder_create(BufferPool *const pool) {
  AV1Decoder *volatile const pbi = aom_memalign(32, sizeof(*pbi));
  if (!pbi) return NULL;
  av1_zero(*pbi);

  AV1_COMMON *volatile const cm = &pbi->common;
  cm->seq_params = &pbi->seq_params;
  cm->error = &pbi->error;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    pbi->error.setjmp = 0;
    av1_decoder_remove(pbi);
    return NULL;
  }

  pbi->error.setjmp = 1;

  CHECK_MEM_ERROR(cm, cm->fc,
                  (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->fc)));
  CHECK_MEM_ERROR(
      cm, cm->default_frame_context,
      (FRAME_CONTEXT *)aom_memalign(32, sizeof(*cm->default_frame_context)));
  memset(cm->fc, 0, sizeof(*cm->fc));
  memset(cm->default_frame_context, 0, sizeof(*cm->default_frame_context));

  pbi->need_resync = 1;
  initialize_dec();

  // Initialize the references to not point to any frame buffers.
  for (int i = 0; i < REF_FRAMES; i++) {
    cm->ref_frame_map[i] = NULL;
  }

  cm->current_frame.frame_number = 0;
  pbi->decoding_first_frame = 1;
  pbi->common.buffer_pool = pool;

  cm->seq_params->bit_depth = AOM_BITS_8;

  cm->mi_params.free_mi = dec_free_mi;
  cm->mi_params.setup_mi = dec_setup_mi;
  cm->mi_params.set_mb_mi = dec_set_mb_mi;

  av1_loop_filter_init(cm);

  av1_qm_init(&cm->quant_params, av1_num_planes(cm));
  av1_loop_restoration_precal();

#if CONFIG_ACCOUNTING
  pbi->acct_enabled = 1;
  aom_accounting_init(&pbi->accounting);
#endif

  pbi->error.setjmp = 0;

  aom_get_worker_interface()->init(&pbi->lf_worker);
  pbi->lf_worker.thread_name = "aom lf worker";

  return pbi;
}